

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O3

int XMLSearch_search_remove_attribute(XMLSearch *search,int i_attr)

{
  int iVar1;
  ulong uVar2;
  XMLAttribute *__dest;
  int iVar3;
  XMLAttribute *__src;
  
  iVar3 = -1;
  if (-1 < i_attr && search != (XMLSearch *)0x0) {
    uVar2 = (ulong)(uint)i_attr;
    iVar1 = search->n_attributes;
    if (i_attr < iVar1) {
      if (iVar1 == 1) {
        __dest = (XMLAttribute *)0x0;
      }
      else {
        __dest = (XMLAttribute *)malloc((ulong)(iVar1 - 1) * 0x18);
        if (__dest == (XMLAttribute *)0x0) {
          return -1;
        }
      }
      __src = search->attributes;
      if (__src[uVar2].name != (SXML_CHAR *)0x0) {
        free(__src[uVar2].name);
        __src = search->attributes;
      }
      if (__src[uVar2].value != (SXML_CHAR *)0x0) {
        free(__src[uVar2].value);
        __src = search->attributes;
      }
      if (__dest != (XMLAttribute *)0x0) {
        memcpy(__dest,__src,uVar2 * 0x18);
        memcpy(__dest + uVar2,__src + uVar2 + 1,(long)(~i_attr + search->n_attributes) * 0x18);
      }
      if (__src != (XMLAttribute *)0x0) {
        free(__src);
      }
      search->attributes = __dest;
      iVar3 = search->n_attributes + -1;
      search->n_attributes = iVar3;
    }
  }
  return iVar3;
}

Assistant:

int XMLSearch_search_remove_attribute(XMLSearch* search, int i_attr)
{
	XMLAttribute* pt;

	if (search == NULL || i_attr < 0 || i_attr >= search->n_attributes)
		return -1;

	/* Free attribute fields first */
	if (search->n_attributes == 1)
		pt = NULL;
	else {
		pt = (XMLAttribute*)__malloc((search->n_attributes - 1) * sizeof(XMLAttribute));
		if (pt == NULL)
			return -1;
	}
	if (search->attributes[i_attr].name != NULL)
		__free(search->attributes[i_attr].name);
	if (search->attributes[i_attr].value != NULL)
		__free(search->attributes[i_attr].value);

	if (pt != NULL) {
		memcpy(pt, search->attributes, i_attr * sizeof(XMLAttribute));
		memcpy(&pt[i_attr], &search->attributes[i_attr + 1], (search->n_attributes - i_attr - 1) * sizeof(XMLAttribute));
	}
	if (search->attributes)
		__free(search->attributes);
	search->attributes = pt;
	search->n_attributes--;

	return search->n_attributes;
}